

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,quatf *value)

{
  quatf qVar1;
  float3 fVar2;
  bool bVar3;
  float4 v;
  array<float,_4UL> local_18;
  
  bVar3 = ParseBasicTypeTuple<float,4ul>(this,&local_18);
  if (bVar3) {
    fVar2._M_elems = local_18._M_elems._4_12_;
    qVar1.real = local_18._M_elems[0];
    qVar1.imag._M_elems[0] = fVar2._M_elems[0];
    qVar1.imag._M_elems[1] = fVar2._M_elems[1];
    qVar1.imag._M_elems[2] = fVar2._M_elems[2];
    *value = qVar1;
  }
  return bVar3;
}

Assistant:

bool AsciiParser::ReadBasicType(value::quatf *value) {
  value::float4 v;
  if (ReadBasicType(&v)) {
    value->real = v[0];
    value->imag[0] = v[1];
    value->imag[1] = v[2];
    value->imag[2] = v[3];
    return true;
  }
  return false;
}